

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Point.h
# Opt level: O3

void anurbs::Point<3l>::
     register_python<pybind11::class_<anurbs::Model,std::shared_ptr<anurbs::Model>>>
               (module *m,class_<anurbs::Model,_std::shared_ptr<anurbs::Model>_> *model)

{
  class_<anurbs::Point<3l>,std::shared_ptr<anurbs::Point<3l>>> *this;
  string name;
  class_<anurbs::Point<3L>,_std::shared_ptr<anurbs::Point<3L>_>_> local_b0;
  long *local_a8;
  long local_98 [2];
  code *local_88;
  undefined8 local_80;
  code *local_78;
  undefined8 local_70;
  arg local_68;
  arg local_58;
  code *local_48;
  undefined8 local_40;
  code *local_38;
  undefined8 local_30;
  arg local_28;
  
  python_name_abi_cxx11_();
  pybind11::class_<anurbs::Point<3L>,_std::shared_ptr<anurbs::Point<3L>_>_>::class_<>
            (&local_b0,(m->super_object).super_handle.m_ptr,(char *)local_a8);
  local_28.name = "location";
  local_28._8_1_ = 2;
  pybind11::class_<anurbs::Point<3L>,_std::shared_ptr<anurbs::Point<3L>_>_>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg>
            (&local_b0,"__init__",(type *)&local_58,(is_new_style_constructor *)&local_68,&local_28)
  ;
  local_58.name = "location";
  local_58._8_1_ = 2;
  local_68.name = "text";
  local_68._8_1_ = 2;
  pybind11::class_<anurbs::Point<3L>,_std::shared_ptr<anurbs::Point<3L>_>_>::
  def<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_oberbichler[P]ANurbs_external_libraries_pybind11_include_pybind11_detail_init_h:173:28),_pybind11::detail::is_new_style_constructor,_pybind11::arg,_pybind11::arg>
            (&local_b0,"__init__",(type *)&local_78,(is_new_style_constructor *)&local_88,&local_58,
             &local_68);
  local_78 = Point<3L>::location;
  local_70 = 0;
  local_88 = Point<3L>::set_location;
  local_80 = 0;
  this = (class_<anurbs::Point<3l>,std::shared_ptr<anurbs::Point<3l>>> *)
         pybind11::class_<anurbs::Point<3l>,std::shared_ptr<anurbs::Point<3l>>>::
         def_property<Eigen::Matrix<double,1,3,1,1,3>(anurbs::Point<3l>::*)()const,void(anurbs::Point<3l>::*)(Eigen::Matrix<double,1,3,1,1,3>const&)>
                   ((class_<anurbs::Point<3l>,std::shared_ptr<anurbs::Point<3l>>> *)&local_b0,
                    "location",(offset_in_Model_to_subr *)&local_78,
                    (offset_in_Model_to_subr *)&local_88);
  local_38 = text_abi_cxx11_;
  local_30 = 0;
  local_48 = Point<3L>::set_text;
  local_40 = 0;
  pybind11::class_<anurbs::Point<3l>,std::shared_ptr<anurbs::Point<3l>>>::
  def_property<std::__cxx11::string(anurbs::Point<3l>::*)()const,void(anurbs::Point<3l>::*)(std::__cxx11::string_const&)>
            (this,"text",(offset_in_Model_to_subr *)&local_38,(offset_in_Model_to_subr *)&local_48);
  pybind11::object::~object((object *)&local_b0);
  Model::register_python_data_type<anurbs::Point<3l>>(m,model);
  if (local_a8 != local_98) {
    operator_delete(local_a8,local_98[0] + 1);
  }
  return;
}

Assistant:

static void register_python(pybind11::module& m, TModel& model)
    {
        using namespace pybind11::literals;
        namespace py = pybind11;

        using Type = Point<TDimension>;
        using Holder = anurbs::Pointer<Type>;

        const std::string name = Type::python_name();

        py::class_<Type, Holder>(m, name.c_str())
            // constructors
            .def(py::init<const Vector&>(), "location"_a)
            .def(py::init<const Vector&, const std::string&>(), "location"_a,
                "text"_a)
            // properties
            .def_property("location", &Type::location, &Type::set_location)
            .def_property("text", &Type::text, &Type::set_text)
        ;

        Model::register_python_data_type<Type>(m, model);
    }